

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall QAbstractItemView::focusNextPrevChild(QAbstractItemView *this,bool next)

{
  bool bVar1;
  int iVar2;
  QAbstractItemViewPrivate *pQVar3;
  byte in_SIL;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QKeyEvent event;
  KeyboardModifier in_stack_ffffffffffffff3c;
  QFlags<Qt::KeyboardModifier> *in_stack_ffffffffffffff40;
  byte local_81;
  undefined1 local_80 [7];
  undefined1 in_stack_ffffffffffffff87;
  QWidget *in_stack_ffffffffffffff88;
  uint local_64;
  QKeyEvent local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x8036e9);
  if (((((pQVar3->tabKeyNavigation & 1U) != 0) &&
       (bVar1 = QWidget::isVisible((QWidget *)0x80370a), bVar1)) &&
      (bVar1 = QWidget::isEnabled((QWidget *)0x80371d), bVar1)) &&
     (bVar1 = QWidget::isEnabled((QWidget *)0x803737), bVar1)) {
    memset(local_60,0xaa,0x58);
    iVar2 = 0x1000002;
    if ((in_SIL & 1) != 0) {
      iVar2 = 0x1000001;
    }
    QFlags<Qt::KeyboardModifier>::QFlags(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    QString::QString((QString *)0x803782);
    QKeyEvent::QKeyEvent
              (local_60,KeyPress,iVar2,(QFlags_conflict1 *)(ulong)local_64,(QString *)local_80,false
               ,1);
    QString::~QString((QString *)0x8037b2);
    (**(code **)(*in_RDI + 0xc0))(in_RDI,local_60);
    bVar1 = QEvent::isAccepted((QEvent *)local_60);
    if (bVar1) {
      local_81 = 1;
    }
    QKeyEvent::~QKeyEvent(local_60);
    if (bVar1) goto LAB_0080381d;
  }
  local_81 = QWidget::focusNextPrevChild(in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
LAB_0080381d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_81 & 1);
}

Assistant:

bool QAbstractItemView::focusNextPrevChild(bool next)
{
    Q_D(QAbstractItemView);
    if (d->tabKeyNavigation && isVisible() && isEnabled() && d->viewport->isEnabled()) {
        QKeyEvent event(QEvent::KeyPress, next ? Qt::Key_Tab : Qt::Key_Backtab, Qt::NoModifier);
        keyPressEvent(&event);
        if (event.isAccepted())
            return true;
    }
    return QAbstractScrollArea::focusNextPrevChild(next);
}